

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall
FIX::Session::nextSequenceReset(Session *this,Message *sequenceReset,UtcTimeStamp *now)

{
  undefined **ppuVar1;
  SessionState *this_00;
  bool bVar2;
  int iVar3;
  IntTConvertor<unsigned_long> *pIVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint64_t uVar7;
  SEQNUM SVar8;
  long *plVar9;
  ulong *puVar10;
  unsigned_long value;
  unsigned_long value_00;
  ulong uVar11;
  undefined8 uVar12;
  uchar *in_R8;
  size_t in_R9;
  NewSeqNo newSeqNo;
  GapFillFlag gapFillFlag;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  string local_190;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  undefined1 local_150 [88];
  string local_f8;
  FieldBase local_d8;
  FieldBase local_80;
  
  BoolField::BoolField((BoolField *)&local_80,0x7b);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f9ed8;
  bVar2 = FieldMap::getFieldIfSet(&sequenceReset->super_FieldMap,&local_80);
  if (bVar2) {
    bVar2 = BoolField::getValue((BoolField *)&local_80);
  }
  else {
    bVar2 = false;
  }
  iVar3 = verify(this,(EVP_PKEY_CTX *)sequenceReset,(uchar *)(ulong)bVar2,(ulong)bVar2,in_R8,in_R9);
  if ((char)iVar3 == '\0') goto LAB_001aa325;
  UInt64Field::UInt64Field((UInt64Field *)&local_d8,0x24);
  local_d8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f9f10;
  bVar2 = FieldMap::getFieldIfSet(&sequenceReset->super_FieldMap,&local_d8);
  if (bVar2) {
    this_00 = &this->m_state;
    pIVar4 = (IntTConvertor<unsigned_long> *)SessionState::getNextTargetMsgSeqNum(this_00);
    IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_f8,pIVar4,value);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x1d1028);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_160 = *plVar9;
      lStack_158 = plVar5[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar9;
      local_170 = (long *)*plVar5;
    }
    local_168 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
    puVar10 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar10) {
      local_1a0 = *puVar10;
      lStack_198 = plVar5[3];
      local_1b0 = &local_1a0;
    }
    else {
      local_1a0 = *puVar10;
      local_1b0 = (ulong *)*plVar5;
    }
    local_1a8 = plVar5[1];
    *plVar5 = (long)puVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pIVar4 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)&local_d8);
    IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_190,pIVar4,value_00);
    uVar11 = 0xf;
    if (local_1b0 != &local_1a0) {
      uVar11 = local_1a0;
    }
    if (uVar11 < local_190._M_string_length + local_1a8) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        uVar12 = local_190.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_190._M_string_length + local_1a8) goto LAB_001aa186;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_1b0);
    }
    else {
LAB_001aa186:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_190._M_dataplus._M_p)
      ;
    }
    local_150._0_8_ = local_150 + 0x10;
    ppuVar1 = (undefined **)(puVar6 + 2);
    if ((undefined **)*puVar6 == ppuVar1) {
      local_150._16_8_ = *ppuVar1;
      local_150._24_8_ = puVar6[3];
    }
    else {
      local_150._16_8_ = *ppuVar1;
      local_150._0_8_ = (undefined **)*puVar6;
    }
    local_150._8_8_ = puVar6[1];
    *puVar6 = ppuVar1;
    puVar6[1] = 0;
    *(undefined1 *)ppuVar1 = 0;
    SessionState::onEvent(this_00,(string *)local_150);
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    uVar7 = UInt64Field::getValue((UInt64Field *)&local_d8);
    SVar8 = SessionState::getNextTargetMsgSeqNum(this_00);
    if (SVar8 < uVar7) {
      uVar7 = UInt64Field::getValue((UInt64Field *)&local_d8);
      UInt64Field::UInt64Field((UInt64Field *)local_150,0x22,uVar7);
      local_150._0_8_ = &PTR__FieldBase_001f9d88;
      uVar7 = UInt64Field::getValue((UInt64Field *)local_150);
      SessionState::setNextTargetMsgSeqNum(this_00,uVar7);
      FieldBase::~FieldBase((FieldBase *)local_150);
    }
    else {
      uVar7 = UInt64Field::getValue((UInt64Field *)&local_d8);
      SVar8 = SessionState::getNextTargetMsgSeqNum(this_00);
      if (uVar7 < SVar8) {
        generateReject(this,sequenceReset,5,0);
      }
    }
  }
  FieldBase::~FieldBase(&local_d8);
LAB_001aa325:
  FieldBase::~FieldBase(&local_80);
  return;
}

Assistant:

void Session::nextSequenceReset(const Message &sequenceReset, const UtcTimeStamp &now) {
  bool isGapFill = false;
  GapFillFlag gapFillFlag;
  if (sequenceReset.getFieldIfSet(gapFillFlag)) {
    isGapFill = gapFillFlag;
  }

  if (!verify(sequenceReset, isGapFill, isGapFill)) {
    return;
  }

  NewSeqNo newSeqNo;
  if (sequenceReset.getFieldIfSet(newSeqNo)) {
    m_state.onEvent(
        "Received SequenceReset FROM: " + SEQNUM_CONVERTOR::convert(getExpectedTargetNum())
        + " TO: " + SEQNUM_CONVERTOR::convert(newSeqNo));

    if (newSeqNo > getExpectedTargetNum()) {
      m_state.setNextTargetMsgSeqNum(MsgSeqNum(newSeqNo));
    } else if (newSeqNo < getExpectedTargetNum()) {
      generateReject(sequenceReset, SessionRejectReason_VALUE_IS_INCORRECT);
    }
  }
}